

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_CmdLineParser.h
# Opt level: O0

bool __thiscall
axl::sl::CmdLineParser<CmdLineParser,_CmdLineSwitchTable>::parse
          (CmdLineParser<CmdLineParser,_CmdLineSwitchTable> *this,int argc,char **argv)

{
  bool bVar1;
  int in_ESI;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *in_RDI;
  int i;
  bool result;
  StringRef *in_stack_000000e0;
  CmdLineParser<CmdLineParser,_CmdLineSwitchTable> *in_stack_000000e8;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  int local_28;
  bool local_1;
  
  local_28 = 0;
  while( true ) {
    if (in_ESI <= local_28) {
      bVar1 = checkMissingValue((CmdLineParser<CmdLineParser,_CmdLineSwitchTable> *)
                                CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
      local_1 = false;
      if (bVar1) {
        local_1 = finalize((CmdLineParser<CmdLineParser,_CmdLineSwitchTable> *)in_RDI);
      }
      return local_1;
    }
    *(int *)&in_RDI->m_p = local_28;
    StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
              (in_RDI,(C *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    bVar1 = processArg(in_stack_000000e8,in_stack_000000e0);
    in_stack_ffffffffffffff9f = bVar1;
    StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
              ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x121d23);
    if (!bVar1) break;
    local_28 = local_28 + 1;
  }
  return false;
}

Assistant:

bool
	parse(
		int argc,
		const char* const* argv
	) {
		bool result;

		for (int i = 0; i < argc; i++) {
			m_argIdx = i;
			result = processArg(argv[i]);
			if (!result)
				return false;
		}

		return
			checkMissingValue() &&
			static_cast<T*>(this)->finalize();
	}